

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_3,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int i;
  float *pfVar2;
  int r;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  undefined8 local_a8;
  float local_a0 [6];
  float local_88 [4];
  float afStack_78 [2];
  Vector<float,_3> res_3;
  undefined4 uStack_64;
  Vector<float,_3> res_1;
  Matrix<float,_4,_3> retVal;
  float afStack_20 [2];
  undefined1 local_18 [4];
  float afStack_14 [5];
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_a8 = *(undefined8 *)(evalCtx->coords).m_data;
    local_a0[0] = (evalCtx->coords).m_data[2];
  }
  else {
    local_a8 = 0x3dcccccd3f8ccccd;
    local_a0[0] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    uVar7 = *(undefined8 *)(evalCtx->coords).m_data;
    uVar8 = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    uVar7._0_4_ = 0.2;
    uVar7._4_4_ = -1.0;
    uVar8._0_4_ = 0.5;
    uVar8._4_4_ = 0.8;
  }
  retVal.m_data.m_data[0].m_data[2] = (float)uVar7;
  retVal.m_data.m_data[0].m_data[3] = SUB84(uVar7,4);
  retVal.m_data.m_data[1].m_data[0] = (float)uVar8;
  retVal.m_data.m_data[1].m_data[1] = SUB84(uVar8,4);
  pfVar2 = res_3.m_data + 2;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  stack0xffffffffffffff98 = 0;
  afStack_78[0] = 0.0;
  afStack_78[1] = 0.0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar9 = _DAT_00a99400;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6 + -0x10) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar3 + -0x10 != lVar6) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x10;
    pfVar2 = pfVar2 + 1;
  } while (lVar5 != 4);
  pfVar2 = afStack_78;
  lVar3 = 0;
  do {
    fVar1 = afStack_20[lVar3 + -10];
    lVar5 = 0;
    do {
      pfVar2[lVar5] = *(float *)((long)local_a0 + lVar5 + -8) * fVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 4);
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  _local_18 = (undefined1  [16])0x0;
  stack0xffffffffffffffd8 = (undefined1  [16])0x0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar12 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar12 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar12;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  pfVar4 = afStack_78;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar2 + lVar5) = pfVar4[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar3 != 4);
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = afStack_20[lVar3 + -6] + afStack_20[lVar3 + -3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_3.m_data._0_8_ = res_3.m_data._0_8_ & 0xffffffff00000000;
  afStack_78[0] = 0.0;
  afStack_78[1] = 0.0;
  lVar3 = 0;
  do {
    res_3.m_data[lVar3 + -2] = local_88[lVar3] + afStack_20[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3 + 2] = res_3.m_data[lVar3 + -2] + *(float *)(local_18 + lVar3 * 4 + 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 1.4013e-45;
  stack0xffffffffffffff98 = CONCAT44(uStack_64,2);
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_3.m_data[lVar3 + -2]] = local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}